

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

bool __thiscall tinyusdz::value::TimeSamples::has_sample_at(TimeSamples *this,double t)

{
  bool bVar1;
  __normal_iterator<tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  local_40;
  double *local_38;
  Sample *local_30;
  __normal_iterator<tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  local_28;
  __normal_iterator<tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  local_20;
  __normal_iterator<tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  it;
  double t_local;
  TimeSamples *this_local;
  
  it._M_current = (Sample *)t;
  if ((this->_dirty & 1U) != 0) {
    update(this);
  }
  local_28._M_current =
       (Sample *)
       ::std::
       vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ::begin(&this->_samples);
  local_30 = (Sample *)
             ::std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::end(&this->_samples);
  local_38 = (double *)&it;
  local_20 = ::std::
             find_if<__gnu_cxx::__normal_iterator<tinyusdz::value::TimeSamples::Sample*,std::vector<tinyusdz::value::TimeSamples::Sample,std::allocator<tinyusdz::value::TimeSamples::Sample>>>,tinyusdz::value::TimeSamples::has_sample_at(double)const::__0>
                       (local_28,(__normal_iterator<tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
                                  )local_30,(anon_class_8_1_54a39814_for__M_pred)local_38);
  local_40._M_current =
       (Sample *)
       ::std::
       vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ::end(&this->_samples);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  return bVar1;
}

Assistant:

bool TimeSamples::has_sample_at(const double t) const {
  if (_dirty) {
    update();
  }

  const auto it = std::find_if(_samples.begin(), _samples.end(), [&t](const Sample &s) {
    return math::is_close(t, s.t);
  });

  return (it != _samples.end());
}